

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

string * __thiscall
fmt::v7::stringifier::operator()[abi_cxx11_
          (string *__return_storage_ptr__,stringifier *this,handle h)

{
  parse_context local_288;
  basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> local_270;
  buffer<char> local_250;
  char local_230 [536];
  
  local_250.size_ = 0;
  local_250._vptr_buffer = (_func_int **)&PTR_grow_00137bd8;
  local_250.capacity_ = 500;
  local_288.format_str_.data_ = (char *)0x0;
  local_288.format_str_.size_ = 0;
  local_288.next_arg_id_ = 0;
  local_270.out_.container = &local_250;
  local_270.args_.desc_ = 0;
  local_270.loc_.locale_ = (void *)0x0;
  local_250.ptr_ = local_230;
  (*h.custom_.format)(h.custom_.value,&local_288,&local_270);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_250.ptr_,local_250.ptr_ + local_250.size_);
  local_250._vptr_buffer = (_func_int **)&PTR_grow_00137bd8;
  if (local_250.ptr_ != local_230) {
    operator_delete(local_250.ptr_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(basic_format_arg<format_context>::handle h) const {
    memory_buffer buf;
    detail::buffer<char>& base = buf;
    format_parse_context parse_ctx({});
    format_context format_ctx(std::back_inserter(base), {}, {});
    h.format(parse_ctx, format_ctx);
    return to_string(buf);
  }